

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O0

void __thiscall binlog::EventStream::readWriterProp(EventStream *this,Range range)

{
  WriterProp *in_RDI;
  WriterProp wp;
  WriterProp *this_00;
  WriterProp local_48;
  
  this_00 = &local_48;
  WriterProp::WriterProp(this_00);
  mserialize::deserialize<binlog::WriterProp,binlog::Range>(this_00,(Range *)in_RDI);
  WriterProp::operator=(this_00,in_RDI);
  WriterProp::~WriterProp((WriterProp *)0x10abd8);
  return;
}

Assistant:

void EventStream::readWriterProp(Range range)
{
  // Make sure _writerProp is updated only if deserialize does not throw
  WriterProp wp;
  mserialize::deserialize(wp, range);
  _writerProp = std::move(wp);
}